

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O0

char * __thiscall ODDLParser::OpenDDLParser::parseHeader(OpenDDLParser *this,char *in,char *end)

{
  char *pcVar1;
  DDLNode *pDVar2;
  bool bVar3;
  DDLNode *node_00;
  ostream *this_00;
  pointer pNVar4;
  char *in_00;
  pointer pPVar5;
  pointer pPVar6;
  allocator<char> local_c1;
  string local_c0;
  Property *local_a0;
  Property *prop_;
  unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> prev;
  unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> prop;
  unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> first;
  allocator<char> local_69;
  undefined1 local_68 [8];
  string nodeName;
  unique_ptr<ODDLParser::Name,_std::default_delete<ODDLParser::Name>_> name;
  Name *name_;
  DDLNode *node;
  Text *id;
  char *end_local;
  char *in_local;
  OpenDDLParser *this_local;
  
  if (in == (char *)0x0) {
    return (char *)0x0;
  }
  if (in == end) {
    return in;
  }
  node = (DDLNode *)0x0;
  id = (Text *)end;
  end_local = in;
  in_local = (char *)this;
  end_local = parseIdentifier(in,end,(Text **)&node);
  end_local = lookForNextToken<char>(end_local,(char *)id);
  if (node == (DDLNode *)0x0) {
    return end_local;
  }
  node_00 = createDDLNode((Text *)node,this);
  if (node_00 == (DDLNode *)0x0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"nullptr returned by creating DDLNode.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    pushNode(this,node_00);
  }
  pDVar2 = node;
  if (node != (DDLNode *)0x0) {
    Text::~Text((Text *)node);
    operator_delete(pDVar2,0x18);
  }
  name._M_t.super___uniq_ptr_impl<ODDLParser::Name,_std::default_delete<ODDLParser::Name>_>._M_t.
  super__Tuple_impl<0UL,_ODDLParser::Name_*,_std::default_delete<ODDLParser::Name>_>.
  super__Head_base<0UL,_ODDLParser::Name_*,_false>._M_head_impl =
       (__uniq_ptr_data<ODDLParser::Name,_std::default_delete<ODDLParser::Name>,_true,_true>)
       (__uniq_ptr_impl<ODDLParser::Name,_std::default_delete<ODDLParser::Name>_>)0x0;
  end_local = parseName(end_local,(char *)id,(Name **)&name);
  std::unique_ptr<ODDLParser::Name,std::default_delete<ODDLParser::Name>>::
  unique_ptr<std::default_delete<ODDLParser::Name>,void>
            ((unique_ptr<ODDLParser::Name,std::default_delete<ODDLParser::Name>> *)
             (nodeName.field_2._M_local_buf + 8),
             (pointer)name._M_t.
                      super___uniq_ptr_impl<ODDLParser::Name,_std::default_delete<ODDLParser::Name>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ODDLParser::Name_*,_std::default_delete<ODDLParser::Name>_>
                      .super__Head_base<0UL,_ODDLParser::Name_*,_false>._M_head_impl);
  bVar3 = std::operator!=((nullptr_t)0x0,
                          (unique_ptr<ODDLParser::Name,_std::default_delete<ODDLParser::Name>_> *)
                          ((long)&nodeName.field_2 + 8));
  if ((bVar3) && (node_00 != (DDLNode *)0x0)) {
    pNVar4 = std::unique_ptr<ODDLParser::Name,_std::default_delete<ODDLParser::Name>_>::operator->
                       ((unique_ptr<ODDLParser::Name,_std::default_delete<ODDLParser::Name>_> *)
                        ((long)&nodeName.field_2 + 8));
    pcVar1 = pNVar4->m_id->m_buffer;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_68,pcVar1,&local_69);
    std::allocator<char>::~allocator(&local_69);
    DDLNode::setName(node_00,(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
  }
  std::unique_ptr<ODDLParser::Property,std::default_delete<ODDLParser::Property>>::
  unique_ptr<std::default_delete<ODDLParser::Property>,void>
            ((unique_ptr<ODDLParser::Property,std::default_delete<ODDLParser::Property>> *)&prop);
  end_local = lookForNextToken<char>(end_local,(char *)id);
  if (*end_local == *Grammar::OpenPropertyToken) {
    end_local = end_local + 1;
    std::unique_ptr<ODDLParser::Property,std::default_delete<ODDLParser::Property>>::
    unique_ptr<std::default_delete<ODDLParser::Property>,void>
              ((unique_ptr<ODDLParser::Property,std::default_delete<ODDLParser::Property>> *)&prev);
    std::unique_ptr<ODDLParser::Property,std::default_delete<ODDLParser::Property>>::
    unique_ptr<std::default_delete<ODDLParser::Property>,void>
              ((unique_ptr<ODDLParser::Property,std::default_delete<ODDLParser::Property>> *)&prop_)
    ;
    while (*end_local != *Grammar::ClosePropertyToken && (Text *)end_local != id) {
      local_a0 = (pointer)0x0;
      end_local = parseProperty(end_local,(char *)id,&local_a0);
      std::unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>::reset
                (&prev,local_a0);
      in_00 = lookForNextToken<char>(end_local,(char *)id);
      pcVar1 = Grammar::ClosePropertyToken;
      end_local = in_00;
      if ((*in_00 != *Grammar::CommaSeparator) && (*in_00 != *Grammar::ClosePropertyToken)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,pcVar1,&local_c1);
        logInvalidTokenError(in_00,&local_c0,this->m_logCallback);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator(&local_c1);
        this_local = (OpenDDLParser *)0x0;
        bVar3 = true;
        goto LAB_00b34408;
      }
      bVar3 = std::operator!=((nullptr_t)0x0,&prev);
      if ((bVar3) && (*end_local != *Grammar::CommaSeparator)) {
        bVar3 = std::operator==((nullptr_t)0x0,&prop);
        if (bVar3) {
          std::unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>::
          operator=(&prop,&prev);
        }
        bVar3 = std::operator!=((nullptr_t)0x0,
                                (unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>
                                 *)&prop_);
        if (bVar3) {
          pPVar6 = std::unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>
                   ::release(&prev);
          pPVar5 = std::unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>
                   ::operator->((unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>
                                 *)&prop_);
          pPVar5->m_next = pPVar6;
        }
        std::unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>::operator=
                  ((unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> *)
                   &prop_,&prev);
      }
    }
    end_local = end_local + 1;
    bVar3 = false;
LAB_00b34408:
    std::unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>::~unique_ptr
              ((unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> *)
               &prop_);
    std::unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>::~unique_ptr
              (&prev);
    if (bVar3) goto LAB_00b34490;
  }
  bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&prop);
  if ((bVar3) && (node_00 != (DDLNode *)0x0)) {
    pPVar6 = std::unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>::
             release(&prop);
    DDLNode::setProperties(node_00,pPVar6);
  }
  bVar3 = false;
LAB_00b34490:
  std::unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>::~unique_ptr
            (&prop);
  std::unique_ptr<ODDLParser::Name,_std::default_delete<ODDLParser::Name>_>::~unique_ptr
            ((unique_ptr<ODDLParser::Name,_std::default_delete<ODDLParser::Name>_> *)
             ((long)&nodeName.field_2 + 8));
  if (!bVar3) {
    return end_local;
  }
  return (char *)this_local;
}

Assistant:

char *OpenDDLParser::parseHeader( char *in, char *end ) {
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    Text *id( ddl_nullptr );
    in = OpenDDLParser::parseIdentifier( in, end, &id );

#ifdef DEBUG_HEADER_NAME
    dumpId( id );
#endif // DEBUG_HEADER_NAME

    in = lookForNextToken( in, end );
    if( ddl_nullptr != id ) {
        // store the node
        DDLNode *node( createDDLNode( id, this ) );
        if( ddl_nullptr != node ) {
            pushNode( node );
        } else {
            std::cerr << "nullptr returned by creating DDLNode." << std::endl;
        }
        delete id;

		Name *name_(ddl_nullptr);
		in = OpenDDLParser::parseName(in, end, &name_);
		std::unique_ptr<Name> name(name_);
        if( ddl_nullptr != name && ddl_nullptr != node ) {
            const std::string nodeName( name->m_id->m_buffer );
            node->setName( nodeName );
        }


		std::unique_ptr<Property> first;
		in = lookForNextToken(in, end);
		if (*in == Grammar::OpenPropertyToken[0]) {
			in++;
			std::unique_ptr<Property> prop, prev;
			while (*in != Grammar::ClosePropertyToken[0] && in != end) {
				Property *prop_(ddl_nullptr);
				in = OpenDDLParser::parseProperty(in, end, &prop_);
				prop.reset(prop_);
				in = lookForNextToken(in, end);

				if (*in != Grammar::CommaSeparator[0] && *in != Grammar::ClosePropertyToken[0]) {
					logInvalidTokenError(in, Grammar::ClosePropertyToken, m_logCallback);
					return ddl_nullptr;
				}

				if (ddl_nullptr != prop && *in != Grammar::CommaSeparator[0]) {
					if (ddl_nullptr == first) {
						first = std::move(prop);
					}
					if (ddl_nullptr != prev) {
						prev->m_next = prop.release();
					}
					prev = std::move(prop);
				}
			}
			++in;
		}

		// set the properties
		if (first && ddl_nullptr != node) {
			node->setProperties(first.release());
		}
    }

    return in;
}